

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoTest(Gia_Man_t *p,Abc_Cex_t *pCex,int fVerbose)

{
  int iVar1;
  Gia_Man_t *pTwo;
  Gia_Man_t *pInit;
  Gia_Man_t *p_00;
  Vec_Int_t *vPermOld;
  Vec_Int_t *vPermNew;
  Gia_Man_t *pAig;
  Gia_Man_t *pDouble;
  Gia_Man_t *pPerm;
  Vec_Int_t *vPerm1;
  Vec_Int_t *vPerm0;
  Vec_Ptr_t *vPisPerm;
  Vec_Ptr_t *vPosEquivs;
  Vec_Int_t *vPiPerm;
  Abc_Cex_t *pCexNew;
  Abc_Cex_t *pAStack_18;
  int fVerbose_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  pCexNew._4_4_ = fVerbose;
  pAStack_18 = pCex;
  pCex_local = (Abc_Cex_t *)p;
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x507,"void Gia_IsoTest(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar1 = Gia_ManRegNum((Gia_Man_t *)pCex_local);
  if (0 < iVar1) {
    iVar1 = Gia_ManPiNum((Gia_Man_t *)pCex_local);
    vPosEquivs = (Vec_Ptr_t *)Gia_IsoTestGenPerm(iVar1);
    printf("Considering random permutation of the primary inputs of the AIG:\n");
    Vec_IntPrint((Vec_Int_t *)vPosEquivs);
    pTwo = Gia_ManDupPerm((Gia_Man_t *)pCex_local,(Vec_Int_t *)vPosEquivs);
    pInit = Gia_ManDupAppendNew((Gia_Man_t *)pCex_local,pTwo);
    p_00 = Gia_ManIsoReduce(pInit,&vPisPerm,(Vec_Ptr_t **)&vPerm0,0,0,0,0);
    Vec_VecFree((Vec_Vec_t *)vPisPerm);
    vPermOld = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vPerm0,0);
    vPermNew = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vPerm0,1);
    vPiPerm = (Vec_Int_t *)Abc_CexPermuteTwo(pAStack_18,vPermOld,vPermNew);
    Vec_VecFree((Vec_Vec_t *)vPerm0);
    iVar1 = Gia_ManVerifyCex((Gia_Man_t *)pCex_local,pAStack_18,0);
    if (iVar1 == 0) {
      printf("CEX for the init AIG is not valid.\n");
    }
    else {
      printf("CEX for the init AIG is valid.\n");
    }
    iVar1 = Gia_ManVerifyCex(pTwo,(Abc_Cex_t *)vPiPerm,0);
    if (iVar1 == 0) {
      printf("CEX for the perm AIG is not valid.\n");
    }
    else {
      printf("CEX for the perm AIG is valid.\n");
    }
    Gia_ManStop(p_00);
    Gia_ManStop(pInit);
    Gia_ManStop(pTwo);
    Vec_IntFree((Vec_Int_t *)vPosEquivs);
    Abc_CexFree((Abc_Cex_t *)vPiPerm);
    return;
  }
  __assert_fail("Gia_ManRegNum(p) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                ,0x508,"void Gia_IsoTest(Gia_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

void Gia_IsoTest( Gia_Man_t * p, Abc_Cex_t * pCex, int fVerbose )
{
    Abc_Cex_t * pCexNew;
    Vec_Int_t * vPiPerm;
    Vec_Ptr_t * vPosEquivs, * vPisPerm;
    Vec_Int_t * vPerm0, * vPerm1;
    Gia_Man_t * pPerm, * pDouble, * pAig;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Gia_ManRegNum(p) > 0 );
    // generate random permutation of PIs
    vPiPerm = Gia_IsoTestGenPerm( Gia_ManPiNum(p) );
    printf( "Considering random permutation of the primary inputs of the AIG:\n" );
    Vec_IntPrint( vPiPerm );
    // create AIG with two primary outputs (original and permuted)
    pPerm = Gia_ManDupPerm( p, vPiPerm );
    pDouble = Gia_ManDupAppendNew( p, pPerm );
//Gia_AigerWrite( pDouble, "test.aig", 0, 0, 0 );

    // analyze the two-output miter
    pAig = Gia_ManIsoReduce( pDouble, &vPosEquivs, &vPisPerm, 0, 0, 0, 0 );
    Vec_VecFree( (Vec_Vec_t *)vPosEquivs );

    // given CEX for output 0, derive CEX for output 1
    vPerm0 = (Vec_Int_t *)Vec_PtrEntry( vPisPerm, 0 );
    vPerm1 = (Vec_Int_t *)Vec_PtrEntry( vPisPerm, 1 );
    pCexNew = Abc_CexPermuteTwo( pCex, vPerm0, vPerm1 );
    Vec_VecFree( (Vec_Vec_t *)vPisPerm );

    // check that original CEX and the resulting CEX is valid
    if ( Gia_ManVerifyCex(p, pCex, 0) )
        printf( "CEX for the init AIG is valid.\n" );
    else
        printf( "CEX for the init AIG is not valid.\n" );
    if ( Gia_ManVerifyCex(pPerm, pCexNew, 0) )
        printf( "CEX for the perm AIG is valid.\n" );
    else
        printf( "CEX for the perm AIG is not valid.\n" );
    // delete
    Gia_ManStop( pAig );
    Gia_ManStop( pDouble );
    Gia_ManStop( pPerm );
    Vec_IntFree( vPiPerm );
    Abc_CexFree( pCexNew );
}